

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseEmitter::onDetach(BaseEmitter *this,CodeHolder *code)

{
  bool bVar1;
  long in_RDI;
  undefined1 local_c8 [23];
  undefined1 local_b1;
  undefined1 *local_a8;
  undefined1 local_91;
  undefined1 local_79;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 *local_60;
  byte local_29;
  byte *local_28;
  undefined1 local_1e;
  byte local_1d;
  
  local_a8 = local_c8;
  local_91 = 0x10;
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (*(EmitterFlags *)(in_RDI + 9),kOwnLogger);
  if (!bVar1) {
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  local_79 = 0x20;
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (*(EmitterFlags *)(in_RDI + 9),kOwnErrorHandler);
  if (!bVar1) {
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  local_69 = 0x30;
  local_b1 = 0xcf;
  local_1d = *(byte *)(in_RDI + 9);
  local_1e = 0x30;
  local_29 = local_1d & 0x30;
  local_28 = (byte *)(in_RDI + 9);
  *local_28 = *local_28 & local_29;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 1;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  local_6a = local_b1;
  local_60 = (undefined8 *)(in_RDI + 0x48);
  memset(&local_68,0,8);
  local_68._0_1_ = 0;
  local_68._1_1_ = 0;
  local_68._2_1_ = 0;
  local_68._3_1_ = 0;
  local_68._4_1_ = 0;
  local_68._5_1_ = 0;
  local_68._6_1_ = 0;
  local_68._7_1_ = 0;
  *(undefined8 *)(in_RDI + 0x48) = local_68;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  return 0;
}

Assistant:

Error BaseEmitter::onDetach(CodeHolder* code) noexcept {
  DebugUtils::unused(code);

  if (!hasOwnLogger())
    _logger = nullptr;

  if (!hasOwnErrorHandler())
    _errorHandler = nullptr;

  _clearEmitterFlags(~kEmitterPreservedFlags);
  _instructionAlignment = uint8_t(0);
  _forcedInstOptions = InstOptions::kReserved;
  _privateData = 0;

  _environment.reset();
  _gpSignature.reset();

  _instOptions = InstOptions::kNone;
  _extraReg.reset();
  _inlineComment = nullptr;
  _funcs.reset();

  return kErrorOk;
}